

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_services.c
# Opt level: O0

void csp_ps(uint16_t node,uint32_t timeout)

{
  csp_conn_t *pcVar1;
  csp_packet_t *conn_00;
  undefined4 in_ESI;
  undefined2 in_DI;
  uint length;
  csp_packet_t *packet;
  csp_conn_t *conn;
  csp_packet_t *in_stack_ffffffffffffffd8;
  ulong uVar2;
  undefined4 in_stack_ffffffffffffffe0;
  uint32_t in_stack_ffffffffffffffe4;
  undefined8 in_stack_fffffffffffffff0;
  uint16_t in_stack_fffffffffffffffc;
  
  pcVar1 = csp_connect((uint8_t)((ushort)in_DI >> 8),in_stack_fffffffffffffffc,
                       (uint8_t)((uint)in_ESI >> 0x18),
                       (uint32_t)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffff0);
  if (pcVar1 != (csp_conn_t *)0x0) {
    conn_00 = csp_buffer_get(0x10b964);
    if (conn_00 != (csp_packet_t *)0x0) {
      (conn_00->field_5).data[0] = 'U';
      conn_00->length = 1;
      csp_send((csp_conn_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
      while (conn_00 = csp_read((csp_conn_t *)conn_00,in_stack_ffffffffffffffe4),
            conn_00 != (csp_packet_t *)0x0) {
        if (conn_00->length < 0x100) {
          uVar2 = (ulong)conn_00->length;
        }
        else {
          uVar2 = 0xff;
        }
        in_stack_ffffffffffffffe4 = (uint32_t)uVar2;
        conn_00->header[uVar2 + 8] = '\0';
        csp_print_func("%s",&conn_00->field_5);
        csp_buffer_free((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      }
      csp_print_func("\r\n");
    }
    csp_buffer_free((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    csp_close((csp_conn_t *)0x10ba3f);
  }
  return;
}

Assistant:

void csp_ps(uint16_t node, uint32_t timeout) {

	/* Open connection */
	csp_conn_t * conn = csp_connect(CSP_PRIO_NORM, node, CSP_PS, 0, CSP_O_CRC32);
	if (conn == NULL) {
		return;
	}

	/* Prepare data */
	csp_packet_t * packet = csp_buffer_get(0);

	/* Check malloc */
	if (packet == NULL) {
		goto out;
	}

	packet->data[0] = 0x55;
	packet->length = 1;

	/* Try to send frame */
	csp_send(conn, packet);

	while (1) {

		/* Read incoming frame */
		packet = csp_read(conn, timeout);
		if (packet == NULL) {
			break;
		}

		/* We have a reply, ensure data is 0 (zero) termianted */
		const unsigned int length = (packet->length < sizeof(packet->data)) ? packet->length : (sizeof(packet->data) - 1);
		packet->data[length] = 0;
		csp_print("%s", packet->data);

		/* Each packet from csp_read must to be freed by user */
		csp_buffer_free(packet);
	}

	csp_print("\r\n");

	/* Clean up */
out:
	csp_buffer_free(packet);
	csp_close(conn);
}